

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeMemoryGrow(Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Name mem)

{
  Name memoryName;
  MemoryGrow *pMVar1;
  bool bVar2;
  Ok local_c9;
  IRBuilder *local_c8;
  size_t local_c0;
  uint local_b4;
  Err local_b0;
  Err *local_80;
  Err *err;
  Result<wasm::Ok> _val;
  MemoryGrow curr;
  IRBuilder *this_local;
  Name mem_local;
  
  mem_local.super_IString.str._M_len = mem.super_IString.str._M_str;
  this_local = mem.super_IString.str._M_len;
  pMVar1 = (MemoryGrow *)
           ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
  curr.memory.super_IString.str._M_str = (char *)this;
  mem_local.super_IString.str._M_str = (char *)__return_storage_ptr__;
  MemoryGrow::MemoryGrow(pMVar1);
  wasm::Name::operator=((Name *)&curr.delta,(Name *)&this_local);
  UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_>::visitMemoryGrow
            ((Result<wasm::Ok> *)&err,
             (UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_> *)this,pMVar1);
  local_80 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
  bVar2 = local_80 != (Err *)0x0;
  if (bVar2) {
    wasm::Err::Err(&local_b0,local_80);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_b0);
    wasm::Err::~Err(&local_b0);
  }
  local_b4 = (uint)bVar2;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
  if (local_b4 == 0) {
    local_c8 = this_local;
    local_c0 = mem_local.super_IString.str._M_len;
    memoryName.super_IString.str._M_str = (char *)mem_local.super_IString.str._M_len;
    memoryName.super_IString.str._M_len = (size_t)this_local;
    pMVar1 = Builder::makeMemoryGrow
                       (&this->builder,
                        (Expression *)
                        curr.super_SpecificExpression<(wasm::Expression::Id)21>.super_Expression.
                        type.id,memoryName,Unspecified);
    push(this,(Expression *)pMVar1);
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_c9);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeMemoryGrow(Name mem) {
  MemoryGrow curr;
  curr.memory = mem;
  CHECK_ERR(visitMemoryGrow(&curr));
  push(builder.makeMemoryGrow(curr.delta, mem));
  return Ok{};
}